

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

void SUNDenseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  FILE *in_RSI;
  long *in_RDI;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_28;
  long local_20;
  
  fprintf(in_RSI,"\n");
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 < *(long *)(*in_RDI + 8); local_28 = local_28 + 1) {
      fprintf(in_RSI,"%12g  ",
              *(undefined8 *)(*(long *)(*(long *)(*in_RDI + 0x20) + local_28 * 8) + local_20 * 8));
    }
    fprintf(in_RSI,"\n");
  }
  fprintf(in_RSI,"\n");
  return;
}

Assistant:

void SUNDenseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_D(A); i++)
  {
    for (j = 0; j < SM_COLUMNS_D(A); j++)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile, "%12Lg  ", SM_ELEMENT_D(A, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#else
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#endif
    }
    fprintf(outfile, "\n");
  }
  fprintf(outfile, "\n");
  return;
}